

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::draw_vertical_line
          (Image *this,ssize_t x,ssize_t y1,ssize_t y2,ssize_t dash_length,uint64_t r,uint64_t g,
          uint64_t b,uint64_t a)

{
  if (y1 <= y2) {
    do {
      if ((dash_length == 0) || ((y1 / dash_length & 1U) == 0)) {
        write_pixel(this,x,y1,r,g,b,a);
      }
      y1 = y1 + 1;
    } while (y2 + 1 != y1);
  }
  return;
}

Assistant:

void Image::draw_vertical_line(ssize_t x, ssize_t y1, ssize_t y2,
    ssize_t dash_length, uint64_t r, uint64_t g, uint64_t b, uint64_t a) {

  for (ssize_t y = y1; y <= y2; y++) {
    if (dash_length && ((y / dash_length) & 1)) {
      continue;
    }
    try {
      this->write_pixel(x, y, r, g, b, a);
    } catch (const out_of_range& e) {
      break;
    }
  }
}